

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O2

void __thiscall
BamTools::SplitTool::SplitToolPrivate::CloseWriters<bool>
          (SplitToolPrivate *this,
          map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
          *writers)

{
  _Base_ptr this_00;
  _Base_ptr p_Var1;
  
  for (p_Var1 = (writers->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(writers->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_00 = p_Var1[1]._M_parent;
    if (this_00 != (_Base_ptr)0x0) {
      BamWriter::Close((BamWriter *)this_00);
      BamWriter::~BamWriter((BamWriter *)this_00);
      operator_delete(this_00);
    }
  }
  std::
  _Rb_tree<bool,_std::pair<const_bool,_BamTools::BamWriter_*>,_std::_Select1st<std::pair<const_bool,_BamTools::BamWriter_*>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
  ::clear(&writers->_M_t);
  return;
}

Assistant:

void SplitTool::SplitToolPrivate::CloseWriters(std::map<T, BamWriter*>& writers)
{

    typedef std::map<T, BamWriter*> WriterMap;
    typedef typename WriterMap::iterator WriterMapIterator;

    // iterate over writers
    WriterMapIterator writerIter = writers.begin();
    WriterMapIterator writerEnd = writers.end();
    for (; writerIter != writerEnd; ++writerIter) {
        BamWriter* writer = (*writerIter).second;
        if (writer == 0) continue;

        // close BamWriter
        writer->Close();

        // destroy BamWriter
        delete writer;
        writer = 0;
    }

    // clear the container (destroying the items doesn't remove them)
    writers.clear();
}